

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffgstm(char *timestr,int *timeref,int *status)

{
  uint uVar1;
  tm *__tp;
  time_t tp;
  
  uVar1 = *status;
  tp = (time_t)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  time(&tp);
  __tp = gmtime(&tp);
  if (timeref == (int *)0x0) {
    if (__tp != (tm *)0x0) goto LAB_001e7254;
  }
  else {
    if (__tp != (tm *)0x0) {
      *timeref = 0;
      goto LAB_001e7254;
    }
    *timeref = 1;
  }
  __tp = localtime(&tp);
LAB_001e7254:
  strftime(timestr,0x19,"%Y-%m-%dT%H:%M:%S",__tp);
  return *status;
}

Assistant:

int ffgstm( char *timestr,   /* O  - returned system date and time string  */
            int  *timeref,   /* O - GMT = 0, Local time = 1  */
            int   *status)   /* IO - error status      */
/*
  Returns the current date and time in format 'yyyy-mm-ddThh:mm:ss'.
*/
{
    time_t tp;
    struct tm *ptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    time(&tp);
    ptr = gmtime(&tp);         /* get GMT (= UTC) time */

    if (timeref)
    {
        if (ptr)
            *timeref = 0;   /* returning GMT */
        else
            *timeref = 1;   /* returning local time */
    }

    if (!ptr)                  /* GMT not available on this machine */
        ptr = localtime(&tp); 

    strftime(timestr, 25, "%Y-%m-%dT%H:%M:%S", ptr);

    return(*status);
}